

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkTSDA.cpp
# Opt level: O2

void __thiscall chrono::ChLinkTSDA::ChLinkTSDA(ChLinkTSDA *this,ChLinkTSDA *other)

{
  ChVariablesGenericDiagonalMass *pCVar1;
  int m_ndof;
  ChVariablesGenericDiagonalMass *this_00;
  undefined1 auVar2 [64];
  
  ChLink::ChLink(&this->super_ChLink,&other->super_ChLink);
  (this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLinkTSDA_01166658;
  (this->m_force_fun).
  super___shared_ptr<chrono::ChLinkTSDA::ForceFunctor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_force_fun).
  super___shared_ptr<chrono::ChLinkTSDA::ForceFunctor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_states).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->m_states).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       0;
  (this->m_Qforce).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->m_Qforce).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       0;
  auVar2 = ZEXT464(0) << 0x40;
  this->m_loc1 = (ChVector<double>)auVar2._0_24_;
  this->m_loc2 = (ChVector<double>)auVar2._24_24_;
  (this->m_aloc1).m_data[0] = (double)auVar2._48_8_;
  (this->m_aloc1).m_data[1] = (double)auVar2._56_8_;
  *(undefined1 (*) [64])((this->m_loc2).m_data + 1) = auVar2;
  this->m_auto_rest_length = other->m_auto_rest_length;
  this->m_rest_length = other->m_rest_length;
  this->m_force = other->m_force;
  std::__shared_ptr<chrono::ChLinkTSDA::ForceFunctor,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_force_fun).
              super___shared_ptr<chrono::ChLinkTSDA::ForceFunctor,_(__gnu_cxx::_Lock_policy)2>,
             &(other->m_force_fun).
              super___shared_ptr<chrono::ChLinkTSDA::ForceFunctor,_(__gnu_cxx::_Lock_policy)2>);
  this->m_ode_fun = other->m_ode_fun;
  this->m_nstates = other->m_nstates;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
            (&this->m_states,&other->m_states);
  pCVar1 = other->m_variables;
  if (pCVar1 != (ChVariablesGenericDiagonalMass *)0x0) {
    this_00 = (ChVariablesGenericDiagonalMass *)::operator_new(0x50);
    m_ndof = (*(pCVar1->super_ChVariables)._vptr_ChVariables[2])(pCVar1);
    ChVariablesGenericDiagonalMass::ChVariablesGenericDiagonalMass(this_00,m_ndof);
    this->m_variables = this_00;
    ChVariablesGenericDiagonalMass::operator=(this_00,other->m_variables);
  }
  return;
}

Assistant:

ChLinkTSDA::ChLinkTSDA(const ChLinkTSDA& other) : ChLink(other) {
    m_auto_rest_length = other.m_auto_rest_length;
    m_rest_length = other.m_rest_length;
    m_force = other.m_force;
    m_force_fun = other.m_force_fun;
    m_ode_fun = other.m_ode_fun;
    m_nstates = other.m_nstates;
    m_states = other.m_states;
    if (other.m_variables) {
        m_variables = new ChVariablesGenericDiagonalMass(other.m_variables->Get_ndof());
        (*m_variables) = (*other.m_variables);
    }
}